

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::draw_image
          (CImg<unsigned_int> *this,int x0,int y0,int z0,int c0,CImg<unsigned_int> *sprite,
          float opacity)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  float fVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  undefined7 extraout_var;
  CImg<unsigned_int> *pCVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 auVar32 [16];
  ulong local_158;
  long local_140;
  long local_130;
  CImg<unsigned_int> local_50;
  
  bVar6 = is_empty(this);
  if ((!bVar6) && (sprite->_data != (uint *)0x0)) {
    bVar6 = is_overlapped<unsigned_int>(this,sprite);
    if (bVar6) {
      operator+(&local_50,sprite);
      this = draw_image(this,x0,y0,z0,c0,&local_50,opacity);
      ~CImg(&local_50);
    }
    else {
      uVar7 = y0 | x0 | z0 | c0;
      if (uVar7 == 0) {
        bVar6 = is_sameXYZC<unsigned_int>(this,sprite);
        uVar7 = (uint)CONCAT71(extraout_var,bVar6);
        if (((1.0 <= opacity) && (bVar6)) && (this->_is_shared == false)) {
          pCVar9 = assign<unsigned_int>(this,sprite,false);
          return pCVar9;
        }
      }
      uVar23 = -(uint)(0 < x0) & x0;
      uVar24 = -(uint)(0 < y0) & y0;
      uVar25 = -(uint)(0 < z0) & z0;
      uVar26 = -(uint)(0 < c0) & c0;
      uVar19 = uVar23 - x0;
      uVar20 = uVar24 - y0;
      uVar21 = uVar25 - z0;
      uVar22 = uVar26 - c0;
      iVar31 = x0 + sprite->_width;
      iVar33 = y0 + sprite->_height;
      iVar34 = z0 + sprite->_depth;
      iVar35 = c0 + sprite->_spectrum;
      iVar27 = (this->_width - iVar31 & -(uint)((int)this->_width < iVar31)) +
               (sprite->_width - uVar19);
      uVar28 = (this->_height - iVar33 & -(uint)((int)this->_height < iVar33)) +
               (sprite->_height - uVar20);
      uVar29 = (this->_depth - iVar34 & -(uint)((int)this->_depth < iVar34)) +
               (sprite->_depth - uVar21);
      uVar30 = (this->_spectrum - iVar35 & -(uint)((int)this->_spectrum < iVar35)) +
               (sprite->_spectrum - uVar22);
      auVar32._0_4_ = -(uint)(0 < iVar27);
      auVar32._4_4_ = -(uint)(0 < (int)uVar28);
      auVar32._8_4_ = -(uint)(0 < (int)uVar29);
      auVar32._12_4_ = -(uint)(0 < (int)uVar30);
      iVar31 = movmskps(uVar7,auVar32);
      if (iVar31 == 0xf) {
        fVar5 = 0.0;
        if (0.0 <= opacity) {
          fVar5 = opacity;
        }
        local_140 = (ulong)uVar26 * 4;
        uVar7 = uVar22;
        for (uVar10 = 0; local_158 = (ulong)uVar7, uVar10 != uVar30; uVar10 = uVar10 + 1) {
          local_130 = (ulong)uVar25 * 4;
          uVar8 = uVar21;
          for (uVar11 = 0; uVar11 != uVar29; uVar11 = uVar11 + 1) {
            lVar17 = (ulong)uVar24 * 4;
            uVar18 = uVar20;
            for (uVar16 = 0; uVar16 != uVar28; uVar16 = uVar16 + 1) {
              uVar15 = (ulong)this->_width;
              uVar14 = (ulong)sprite->_width;
              uVar1 = sprite->_height;
              uVar2 = sprite->_depth;
              puVar3 = this->_data;
              puVar4 = sprite->_data;
              if (1.0 <= opacity) {
                lVar12 = this->_height * uVar15;
                lVar13 = uVar1 * uVar14;
                memcpy(puVar3 + (ulong)uVar23 +
                                (uVar24 + uVar16) * uVar15 +
                                lVar12 * (uVar25 + uVar11) +
                                (ulong)this->_depth * (uVar26 + uVar10) * lVar12,
                       puVar4 + (ulong)uVar19 +
                                (uVar20 + (int)uVar16) * uVar14 +
                                lVar13 * (ulong)(uVar21 + (int)uVar11) +
                                (ulong)uVar2 * (ulong)(uVar22 + (int)uVar10) * lVar13,
                       (long)iVar27 * 4);
              }
              else {
                lVar13 = (((ulong)this->_depth * local_140 + local_130) * (ulong)this->_height +
                         lVar17) * uVar15 + (ulong)uVar23 * 4;
                for (lVar12 = 0; iVar27 != (int)lVar12; lVar12 = lVar12 + 1) {
                  *(int *)((long)puVar3 + lVar12 * 4 + lVar13) =
                       (int)(long)((float)*(uint *)((long)puVar4 +
                                                   lVar12 * 4 +
                                                   (((ulong)uVar2 * local_158 * 4 + (ulong)uVar8 * 4
                                                    ) * (ulong)uVar1 + (ulong)uVar18 * 4) * uVar14 +
                                                   (ulong)uVar19 * 4) * ABS(opacity) +
                                  (float)*(uint *)((long)puVar3 + lVar12 * 4 + lVar13) *
                                  (1.0 - fVar5));
                }
              }
              lVar17 = lVar17 + 4;
              uVar18 = uVar18 + 1;
            }
            local_130 = local_130 + 4;
            uVar8 = uVar8 + 1;
          }
          local_140 = local_140 + 4;
          uVar7 = uVar7 + 1;
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared())
        return assign(sprite,false);
      const bool bx = x0<0, by = y0<0, bz = z0<0, bc = c0<0;
      const int
        dx0 = bx?0:x0, dy0 = by?0:y0, dz0 = bz?0:z0, dc0 = bc?0:c0,
        sx0 = dx0 - x0,  sy0 = dy0 - y0, sz0 = dz0 - z0, sc0 = dc0 - c0,
        lx = sprite.width() - sx0 - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0),
        ly = sprite.height() - sy0 - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0),
        lz = sprite.depth() - sz0 - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0),
        lc = sprite.spectrum() - sc0 - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0);
      const ulongT slx = lx*sizeof(T);

      const float nopacity = cimg::abs(opacity), copacity = 1 - std::max(opacity,0.f);
      if (lx>0 && ly>0 && lz>0 && lc>0) {
        for (int c = 0; c<lc; ++c)
          for (int z = 0; z<lz; ++z)
            for (int y = 0; y<ly; ++y) {
              T *ptrd = data(dx0,dy0 + y,dz0 + z,dc0 + c);
              const T *ptrs = sprite.data(sx0,sy0 + y,sz0 + z,sc0 + c);
              if (opacity>=1) std::memcpy(ptrd,ptrs,slx);
              else for (int x = 0; x<lx; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
            }
      }
      return *this;
    }